

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

int __thiscall
gmlc::utilities::strViewToInteger<int>(utilities *this,string_view input,size_t *charactersUsed)

{
  out_of_range *this_00;
  char cVar1;
  long *plVar2;
  code *pcVar3;
  undefined *puVar4;
  char *__first;
  utilities *puVar5;
  __integer_from_chars_result_type<int> _Var6;
  int val;
  
  plVar2 = (long *)input._M_str;
  __first = (char *)input._M_len;
  val = 0;
  if (plVar2 != (long *)0x0) {
    *plVar2 = 0;
  }
  puVar5 = (utilities *)0x0;
  if ((utilities *)0x1 < this) {
    do {
      if (__first[(long)puVar5] != ' ') {
        if ((__first[(long)puVar5] != '0') || ((byte)((__first + 1)[(long)puVar5] | 0x20U) == 0x78))
        goto LAB_00240b77;
        cVar1 = '0';
        goto LAB_00240bb9;
      }
      puVar5 = puVar5 + 1;
    } while (this != puVar5);
LAB_00240b5d:
    if (plVar2 == (long *)0x0) {
      return 0;
    }
    goto LAB_00240ba2;
  }
LAB_00240b7d:
  _Var6 = CLI::std::from_chars<int>(__first,(char *)(this + (long)__first),&val,10);
  if (_Var6.ec != 0) {
    if (_Var6.ec == result_out_of_range) {
      if (plVar2 != (long *)0x0) {
        *plVar2 = (long)_Var6.ptr - (long)__first;
      }
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range
                (this_00,"conversion type does not support the string conversion");
      puVar4 = &std::out_of_range::typeinfo;
      pcVar3 = std::out_of_range::~out_of_range;
    }
    else {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                ((invalid_argument *)this_00,"unable to convert string");
      puVar4 = &std::invalid_argument::typeinfo;
      pcVar3 = std::invalid_argument::~invalid_argument;
    }
    __cxa_throw(this_00,puVar4,pcVar3);
  }
  if (plVar2 == (long *)0x0) {
    return val;
  }
  this = (utilities *)(_Var6.ptr + ((long)puVar5 - (long)__first));
LAB_00240ba2:
  *plVar2 = (long)this;
  return val;
LAB_00240bb9:
  if (cVar1 != '0') goto LAB_00240b77;
  if (this + -1 == puVar5) goto LAB_00240b5d;
  cVar1 = (__first + 1)[(long)puVar5];
  puVar5 = puVar5 + 1;
  goto LAB_00240bb9;
LAB_00240b77:
  __first = __first + (long)puVar5;
  this = this + -(long)puVar5;
  goto LAB_00240b7d;
}

Assistant:

X strViewToInteger(std::string_view input, size_t* charactersUsed = nullptr)
{
    static_assert(std::is_integral_v<X>, "requested type is not integral");
    X val{0};
    if (charactersUsed != nullptr) {
        *charactersUsed = 0;
    }
    std::size_t additionalChars{0};
    if (input.size() > 1) {
        while (input[0] == ' ') {
            input.remove_prefix(1);
            ++additionalChars;
            if (input.empty()) {
                if (charactersUsed != nullptr) {
                    *charactersUsed = additionalChars;
                }
                return val;
            }
        }
        if (input.front() == '0') {
            if (input[1] != 'X' && input[1] != 'x') {
                while (input[0] == '0') {
                    input.remove_prefix(1);
                    ++additionalChars;
                    if (input.empty()) {
                        if (charactersUsed != nullptr) {
                            *charactersUsed = additionalChars;
                        }
                        return val;
                    }
                }
            }
        }
    }
    auto conversionResult =
        std::from_chars(input.data(), input.data() + input.size(), val);
    if (conversionResult.ec == std::errc()) {
        if (charactersUsed != nullptr) {
            *charactersUsed =
                (conversionResult.ptr - input.data()) + additionalChars;
        }
        return val;
    }
    if (conversionResult.ec == std::errc::result_out_of_range) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        throw(std::out_of_range(
            "conversion type does not support the string conversion"));
    }
    if constexpr (std::is_unsigned_v<X>) {
        if (input.size() > 1 && input.front() == '-') {
            auto signedVal =
                strViewToInteger<std::make_signed_t<X>>(input, charactersUsed);
            // additional chars must be 0 in this case otherwise it should have
            // been an error
            return static_cast<X>(signedVal);
        }
    }
    throw(std::invalid_argument("unable to convert string"));
}